

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::DeAllocate(MemoryPage *this,void *p)

{
  Char *Message;
  char (*in_RCX) [29];
  undefined1 local_38 [8];
  string msg;
  void *p_local;
  MemoryPage *this_local;
  
  msg.field_2._8_8_ = p;
  if (this->m_pOwnerAllocator == (FixedBlockMemoryAllocator *)0x0) {
    FormatString<char[26],char[29]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pOwnerAllocator != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DeAllocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x9c);
    std::__cxx11::string::~string((string *)local_38);
  }
  dbgVerifyAddress(this,(void *)msg.field_2._8_8_);
  FillWithDebugPattern((void *)msg.field_2._8_8_,0xde,this->m_pOwnerAllocator->m_BlockSize);
  *(void **)msg.field_2._8_8_ = this->m_pNextFreeBlock;
  this->m_pNextFreeBlock = (void *)msg.field_2._8_8_;
  this->m_NumFreeBlocks = this->m_NumFreeBlocks + 1;
  return;
}

Assistant:

void FixedBlockMemoryAllocator::MemoryPage::DeAllocate(void* p)
{
    VERIFY_EXPR(m_pOwnerAllocator != nullptr);

    dbgVerifyAddress(p);
    FillWithDebugPattern(p, DeallocatedBlockMemPattern, m_pOwnerAllocator->m_BlockSize);
    // Add block to the beginning of the linked list
    *reinterpret_cast<void**>(p) = m_pNextFreeBlock;
    m_pNextFreeBlock             = p;
    ++m_NumFreeBlocks;
}